

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall Assimp::ColladaExporter::WriteTextures(ColladaExporter *this)

{
  ulong uVar1;
  char *pcVar2;
  pointer pcVar3;
  IOSystem *pIVar4;
  long lVar5;
  ColladaExporter *pCVar6;
  int iVar7;
  long *plVar8;
  undefined4 extraout_var;
  aiScene *paVar9;
  runtime_error *this_00;
  ulong uVar10;
  long *plVar11;
  size_type *psVar12;
  ulong uVar13;
  uint uVar14;
  char *pcVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  __string_type __str;
  string name;
  char str [1024];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  undefined1 local_530 [8];
  _Alloc_hider local_528;
  undefined1 local_520 [24];
  long *local_508;
  long local_500;
  long local_4f8;
  long lStack_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  long *local_4c8;
  long local_4c0;
  long local_4b8;
  long lStack_4b0;
  ColladaExporter *local_4a8;
  aiTexture *local_4a0;
  long *local_498 [2];
  long local_488 [2];
  long *local_478;
  long local_470;
  long local_468;
  long lStack_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_458;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
  *local_450;
  ulong local_448;
  ulong local_440;
  char local_438;
  char local_437 [1031];
  IOStream *file;
  
  paVar9 = this->mScene;
  if ((paVar9->mTextures != (aiTexture **)0x0) && (paVar9->mNumTextures != 0)) {
    local_458 = &this->mPath;
    local_450 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                 *)&this->textures;
    uVar13 = 0;
    local_4a8 = this;
    do {
      local_4a0 = paVar9->mTextures[uVar13];
      uVar1 = uVar13 + 1;
      if (local_4a0 != (aiTexture *)0x0) {
        uVar14 = 1;
        pcVar15 = &local_438;
        uVar10 = uVar1 & 0xffffffff;
        if ((int)uVar1 < 0) {
          local_438 = '-';
          uVar10 = (ulong)~(uint)uVar13;
          uVar14 = 2;
          pcVar15 = local_437;
        }
        iVar7 = 1000000000;
        bVar16 = false;
        do {
          lVar5 = (long)(int)uVar10 / (long)iVar7;
          bVar17 = (int)lVar5 != 0;
          bVar18 = iVar7 == 1;
          if ((bVar16 || bVar18) || bVar17) {
            pcVar2 = pcVar15 + 1;
            *pcVar15 = (char)lVar5 + '0';
            pcVar15 = pcVar2;
            if (iVar7 == 1) break;
            uVar14 = uVar14 + 1;
            uVar10 = (long)(int)uVar10 % (long)iVar7 & 0xffffffff;
          }
          iVar7 = iVar7 / 10;
          bVar16 = (bool)(bVar16 | bVar18 | bVar17);
        } while (uVar14 < 0x400);
        *pcVar15 = '\0';
        local_498[0] = local_488;
        pcVar3 = (local_4a8->mFile)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_498,pcVar3,pcVar3 + (local_4a8->mFile)._M_string_length);
        std::__cxx11::string::append((char *)local_498);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_498);
        local_4c8 = &local_4b8;
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_4b8 = *plVar11;
          lStack_4b0 = plVar8[3];
        }
        else {
          local_4b8 = *plVar11;
          local_4c8 = (long *)*plVar8;
        }
        local_4c0 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_4c8);
        pCVar6 = local_4a8;
        local_478 = &local_468;
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_468 = *plVar11;
          lStack_460 = plVar8[3];
        }
        else {
          local_468 = *plVar11;
          local_478 = (long *)*plVar8;
        }
        local_470 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_478);
        local_508 = &local_4f8;
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_4f8 = *plVar11;
          lStack_4f0 = plVar8[3];
        }
        else {
          local_4f8 = *plVar11;
          local_508 = (long *)*plVar8;
        }
        local_500 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_508);
        psVar12 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_550.field_2._M_allocated_capacity = *psVar12;
          local_550.field_2._8_8_ = plVar8[3];
          local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        }
        else {
          local_550.field_2._M_allocated_capacity = *psVar12;
          local_550._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_550._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_550);
        local_530 = (undefined1  [8])local_520;
        psVar12 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar12) {
          local_520._0_8_ = *psVar12;
          local_520._8_8_ = plVar8[3];
        }
        else {
          local_520._0_8_ = *psVar12;
          local_530 = (undefined1  [8])*plVar8;
        }
        local_528._M_p = (pointer)plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)local_530);
        psVar12 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_4e8.field_2._M_allocated_capacity = *psVar12;
          local_4e8.field_2._8_8_ = plVar8[3];
          local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
        }
        else {
          local_4e8.field_2._M_allocated_capacity = *psVar12;
          local_4e8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_4e8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_530 != (undefined1  [8])local_520) {
          operator_delete((void *)local_530,local_520._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        if (local_508 != &local_4f8) {
          operator_delete(local_508,local_4f8 + 1);
        }
        if (local_478 != &local_468) {
          operator_delete(local_478,local_468 + 1);
        }
        local_448 = uVar1;
        if (local_4c8 != &local_4b8) {
          operator_delete(local_4c8,local_4b8 + 1);
        }
        local_440 = uVar13;
        if (local_498[0] != local_488) {
          operator_delete(local_498[0],local_488[0] + 1);
        }
        pIVar4 = pCVar6->mIOSystem;
        (*pIVar4->_vptr_IOSystem[3])(pIVar4);
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        pcVar3 = (pCVar6->mPath)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_550,pcVar3,pcVar3 + (pCVar6->mPath)._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)&local_550,local_550._M_string_length,0,'\x01');
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_550,(ulong)local_4e8._M_dataplus._M_p);
        uVar13 = local_440;
        psVar12 = (size_type *)(plVar8 + 2);
        local_508 = &local_4f8;
        if ((size_type *)*plVar8 == psVar12) {
          local_520._0_8_ = *psVar12;
          local_520._8_8_ = plVar8[3];
          local_530 = (undefined1  [8])local_520;
        }
        else {
          local_520._0_8_ = *psVar12;
          local_530 = (undefined1  [8])*plVar8;
        }
        local_528._M_p = (pointer)plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"wb","");
        iVar7 = (*pIVar4->_vptr_IOSystem[4])(pIVar4,local_530,local_508);
        file = (IOStream *)CONCAT44(extraout_var,iVar7);
        if (local_508 != &local_4f8) {
          operator_delete(local_508,local_4f8 + 1);
        }
        if (local_530 != (undefined1  [8])local_520) {
          operator_delete((void *)local_530,local_520._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        if (file == (IOStream *)0x0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_550,"could not open output texture file: ",local_458);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_530,&local_550,&local_4e8);
          std::runtime_error::runtime_error(this_00,(string *)local_530);
          *(undefined ***)this_00 = &PTR__runtime_error_007da4b8;
          __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (local_4a0->mHeight == 0) {
          (*file->_vptr_IOStream[3])(file,local_4a0->pcData,(ulong)local_4a0->mWidth,1);
        }
        else {
          Bitmap::Save(local_4a0,file);
        }
        (*file->_vptr_IOStream[7])(file);
        local_530._0_4_ = (uint)uVar13;
        local_528._M_p = local_520 + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_528,local_4e8._M_dataplus._M_p,
                   local_4e8._M_dataplus._M_p + local_4e8._M_string_length);
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<unsigned_int,std::__cxx11::string>>
                  (local_450,
                   (pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_530);
        if (local_528._M_p != local_520 + 8) {
          operator_delete(local_528._M_p,local_520._8_8_ + 1);
        }
        (*file->_vptr_IOStream[1])(file);
        uVar1 = local_448;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
        paVar9 = pCVar6->mScene;
      }
      uVar13 = uVar1;
    } while (uVar13 < paVar9->mNumTextures);
  }
  return;
}

Assistant:

void ColladaExporter::WriteTextures() {
    static const unsigned int buffer_size = 1024;
    char str[buffer_size];

    if (mScene->HasTextures()) {
        for(unsigned int i = 0; i < mScene->mNumTextures; i++) {
            // It would be great to be able to create a directory in portable standard C++, but it's not the case,
            // so we just write the textures in the current directory.

            aiTexture* texture = mScene->mTextures[i];
            if ( nullptr == texture ) {
                continue;
            }

            ASSIMP_itoa10(str, buffer_size, i + 1);

            std::string name = mFile + "_texture_" + (i < 1000 ? "0" : "") + (i < 100 ? "0" : "") + (i < 10 ? "0" : "") + str + "." + ((const char*) texture->achFormatHint);

            std::unique_ptr<IOStream> outfile(mIOSystem->Open(mPath + mIOSystem->getOsSeparator() + name, "wb"));
            if(outfile == NULL) {
                throw DeadlyExportError("could not open output texture file: " + mPath + name);
            }

            if(texture->mHeight == 0) {
                outfile->Write((void*) texture->pcData, texture->mWidth, 1);
            } else {
                Bitmap::Save(texture, outfile.get());
            }

            outfile->Flush();

            textures.insert(std::make_pair(i, name));
        }
    }
}